

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O2

int32_t icu_63::anon_unknown_0::getOverlap
                  (uint16_t *p,int32_t length,uint16_t *q,int32_t qStart,int32_t blockLength)

{
  int iVar1;
  bool bVar2;
  int length_00;
  long lVar3;
  uint16_t *s;
  
  lVar3 = (long)blockLength;
  s = p + (length - lVar3);
  iVar1 = blockLength + -1;
  do {
    length_00 = iVar1;
    s = s + 1;
    if (lVar3 < 2) {
      return length_00;
    }
    bVar2 = equalBlocks(s,q + qStart,length_00);
    lVar3 = lVar3 + -1;
    iVar1 = length_00 + -1;
  } while (!bVar2);
  return length_00;
}

Assistant:

int32_t getOverlap(const uint16_t *p, int32_t length,
                   const uint16_t *q, int32_t qStart, int32_t blockLength) {
    int32_t overlap = blockLength - 1;
    U_ASSERT(overlap <= length);
    q += qStart;
    while (overlap > 0 && !equalBlocks(p + (length - overlap), q, overlap)) {
        --overlap;
    }
    return overlap;
}